

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

cmTarget * __thiscall
cmLocalGenerator::LinearGetTargetWithOutput(cmLocalGenerator *this,string *name)

{
  pointer ppcVar1;
  cmTarget *this_00;
  bool bVar2;
  bool bVar3;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar4;
  pointer ppcVar5;
  cmTarget *unaff_R14;
  
  ppcVar5 = (this->Makefile->OrderedTargets).
            super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar1 = (this->Makefile->OrderedTargets).
            super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppcVar5 == ppcVar1) {
      return (cmTarget *)0x0;
    }
    this_00 = *ppcVar5;
    pvVar4 = cmTarget::GetPreBuildCommands(this_00);
    bVar2 = anon_unknown.dwarf_9a5a57::AnyTargetCommandOutputMatches(name,pvVar4);
    if (bVar2) {
LAB_00292ea1:
      bVar2 = false;
      unaff_R14 = this_00;
    }
    else {
      pvVar4 = cmTarget::GetPreLinkCommands(this_00);
      bVar2 = anon_unknown.dwarf_9a5a57::AnyTargetCommandOutputMatches(name,pvVar4);
      if (bVar2) goto LAB_00292ea1;
      pvVar4 = cmTarget::GetPostBuildCommands(this_00);
      bVar3 = anon_unknown.dwarf_9a5a57::AnyTargetCommandOutputMatches(name,pvVar4);
      bVar2 = !bVar3;
      if (bVar3) {
        unaff_R14 = this_00;
      }
    }
    if (!bVar2) {
      return unaff_R14;
    }
    ppcVar5 = ppcVar5 + 1;
  } while( true );
}

Assistant:

cmTarget* cmLocalGenerator::LinearGetTargetWithOutput(
  const std::string& name) const
{
  // We go through the ordered vector of targets to get reproducible results
  // should multiple names match.
  for (cmTarget* t : this->Makefile->GetOrderedTargets()) {
    // Does the output of any command match the source file name?
    if (AnyTargetCommandOutputMatches(name, t->GetPreBuildCommands())) {
      return t;
    }
    if (AnyTargetCommandOutputMatches(name, t->GetPreLinkCommands())) {
      return t;
    }
    if (AnyTargetCommandOutputMatches(name, t->GetPostBuildCommands())) {
      return t;
    }
  }
  return nullptr;
}